

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree *
capnp::anon_unknown_2::print
          (StringTree *__return_storage_ptr__,Reader *value,Which which,Indent indent,PrintMode mode
          )

{
  uint *__return_storage_ptr___00;
  Field field_00;
  Field field_01;
  ReaderFor<bool> RVar1;
  bool bVar2;
  uint16_t uVar3;
  Which WVar4;
  Type TVar5;
  uint uVar6;
  uint uVar7;
  Indent indent_00;
  Array<kj::StringTree> *other;
  NullableValue<capnp::EnumSchema::Enumerant> *other_00;
  Enumerant *pEVar8;
  StringTree *pSVar9;
  uint *puVar10;
  char (*params) [22];
  undefined8 extraout_RDX;
  undefined4 in_register_00000084;
  char *pcVar11;
  ReaderFor<capnp::DynamicEnum> RVar12;
  Iterator IVar13;
  ArrayPtr<const_char> AVar14;
  undefined1 local_871 [25];
  StringTree local_858;
  kj local_819;
  Array<kj::StringTree> local_818;
  uint local_7fc;
  Field *local_7f8;
  Schema SStack_7f0;
  uint local_7e8;
  undefined4 uStack_7e4;
  SegmentReader *pSStack_7e0;
  CapTableReader *local_7d8;
  void *pvStack_7d0;
  WirePointer *local_7c8;
  StructDataBitCount SStack_7c0;
  StructPointerCount SStack_7bc;
  undefined2 uStack_7ba;
  Reader local_7b0;
  StringTree local_768;
  Reader local_730;
  ArrayPtr<const_char> local_700;
  StringTree local_6f0;
  Field *local_6b8;
  Schema SStack_6b0;
  uint local_6a8;
  undefined4 uStack_6a4;
  SegmentReader *pSStack_6a0;
  CapTableReader *local_698;
  void *pvStack_690;
  WirePointer *local_688;
  StructDataBitCount SStack_680;
  StructPointerCount SStack_67c;
  undefined2 uStack_67a;
  Field *local_670;
  Field *unionField;
  Field field_1;
  undefined1 local_618 [8];
  Iterator __end3;
  undefined1 local_5f8 [8];
  Iterator __begin3;
  FieldSubset *__range3;
  Reader local_590;
  StringTree local_548;
  ArrayPtr<const_char> local_510;
  StringTree local_500;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 local_488 [8];
  Reader fieldProto;
  Field *field;
  StringTree unionValue;
  Maybe<capnp::StructSchema::Field> which_2;
  Vector<kj::StringTree> printedFields;
  undefined1 local_3a8 [8];
  FieldSubset nonUnionFields;
  undefined1 local_358 [8];
  FieldSubset unionFields;
  ReaderFor<capnp::DynamicStruct> structValue;
  uint16_t local_2d0;
  kj local_2cd;
  undefined4 local_2cc;
  Reader local_2c8;
  ArrayPtr<const_char> local_298;
  Maybe<capnp::EnumSchema::Enumerant> local_288;
  undefined1 local_240 [8];
  NullableValue<capnp::EnumSchema::Enumerant> enumerant;
  undefined1 local_1e8 [8];
  ReaderFor<capnp::DynamicEnum> enumValue;
  Array<kj::StringTree> local_1d0;
  StringTree local_1b8;
  kj local_179;
  anon_class_16_2_0bb6b726 local_178;
  Mapper<capnp::DynamicList::Reader_&> local_168;
  undefined1 local_160 [8];
  Array<kj::StringTree> elements;
  Which local_132;
  undefined1 local_130 [6];
  Which which_1;
  ReaderFor<capnp::DynamicList> listValue;
  String local_d9;
  String local_c0;
  kj local_a1;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_unsigned_char> local_80;
  ArrayPtr<const_char> local_70;
  undefined1 auStack_60 [8];
  ArrayPtr<const_char> chars;
  ReaderFor<float> local_44;
  ReaderFor<unsigned_long> local_40;
  ReaderFor<long> local_38;
  char *local_30;
  PrintMode local_28;
  Which local_22;
  PrintMode mode_local;
  Which which_local;
  Reader *value_local;
  StringTree *pSStack_10;
  Indent indent_local;
  
  pcVar11 = (char *)CONCAT44(in_register_00000084,mode);
  local_28 = mode;
  local_22 = which;
  _mode_local = value;
  value_local._4_4_ = indent.amount;
  pSStack_10 = __return_storage_ptr__;
  TVar5 = DynamicValue::Reader::getType(value);
  puVar10 = &switchD_0084b7c2::switchdataD_00ab5f7c;
  switch(TVar5) {
  case UNKNOWN:
    kj::strTree<char_const(&)[2]>(__return_storage_ptr__,(kj *)0xad44e1,(char (*) [2])params);
    break;
  case VOID:
    kj::strTree<char_const(&)[5]>(__return_storage_ptr__,(kj *)"void",(char (*) [5])params);
    break;
  case BOOL:
    RVar1 = DynamicValue::Reader::as<bool>(_mode_local);
    local_30 = "false";
    if (RVar1) {
      local_30 = "true";
    }
    kj::strTree<char_const*>
              (__return_storage_ptr__,(kj *)&local_30,
               (char **)CONCAT71((int7)((ulong)extraout_RDX >> 8),RVar1));
    break;
  case INT:
    local_38 = DynamicValue::Reader::as<long>(_mode_local);
    kj::strTree<long>(__return_storage_ptr__,&local_38);
    break;
  case UINT:
    local_40 = DynamicValue::Reader::as<unsigned_long>(_mode_local);
    kj::strTree<unsigned_long>(__return_storage_ptr__,&local_40);
    break;
  case FLOAT:
    if (local_22 == FLOAT32) {
      local_44 = DynamicValue::Reader::as<float>(_mode_local);
      kj::strTree<float>(__return_storage_ptr__,&local_44);
    }
    else {
      chars.size_ = (size_t)DynamicValue::Reader::as<double>(_mode_local);
      kj::strTree<double>(__return_storage_ptr__,(double *)&chars.size_);
    }
    break;
  case TEXT:
  case DATA:
    kj::ArrayPtr<const_char>::ArrayPtr((ArrayPtr<const_char> *)auStack_60);
    TVar5 = DynamicValue::Reader::getType(_mode_local);
    if (TVar5 == DATA) {
      local_80 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(_mode_local);
      local_70 = kj::ArrayPtr<const_unsigned_char>::asChars(&local_80);
      auStack_60 = (undefined1  [8])local_70.ptr;
      chars.ptr = (char *)local_70.size_;
    }
    else {
      local_a0 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(_mode_local);
      local_90 = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_a0);
      auStack_60 = (undefined1  [8])local_90.ptr;
      chars.ptr = (char *)local_90.size_;
    }
    local_a1 = (kj)0x22;
    local_d9.content._1_8_ = auStack_60;
    local_d9.content._9_8_ = chars.ptr;
    AVar14.size_ = (size_t)puVar10;
    AVar14.ptr = chars.ptr;
    kj::encodeCEscape(&local_c0,(kj *)auStack_60,AVar14);
    local_d9.content.ptr._0_1_ = 0x22;
    kj::strTree<char,kj::String,char>
              (__return_storage_ptr__,&local_a1,(char *)&local_c0,&local_d9,pcVar11);
    kj::String::~String(&local_c0);
    break;
  case LIST:
    DynamicValue::Reader::as<capnp::DynamicList>
              ((ReaderFor<capnp::DynamicList> *)local_130,_mode_local);
    join_0x00000010_0x00000000_ =
         (Type)DynamicList::Reader::getSchema((ReaderFor<capnp::DynamicList> *)local_130);
    local_132 = ListSchema::whichElementType((ListSchema *)&elements.disposer);
    kj::_::Mapper<capnp::DynamicList::Reader_&>::Mapper
              (&local_168,(ReaderFor<capnp::DynamicList> *)local_130);
    local_178.which = &local_132;
    local_178.indent = (Indent *)((long)&value_local + 4);
    kj::_::Mapper<capnp::DynamicList::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_stringify_c__:157:44)>
              ((Array<kj::StringTree> *)local_160,&local_168,&local_178);
    local_179 = (kj)0x5b;
    other = kj::mv<kj::Array<kj::StringTree>>((Array<kj::StringTree> *)local_160);
    kj::Array<kj::StringTree>::Array(&local_1d0,other);
    pcVar11 = (char *)0x0;
    Indent::delimit(&local_1b8,(Indent *)((long)&value_local + 4),&local_1d0,local_28,LIST);
    enumValue._15_1_ = 0x5d;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,&local_179,(char *)&local_1b8,
               (StringTree *)&enumValue.field_0xf,pcVar11);
    kj::StringTree::~StringTree(&local_1b8);
    kj::Array<kj::StringTree>::~Array(&local_1d0);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_160);
    break;
  case ENUM:
    RVar12 = DynamicValue::Reader::as<capnp::DynamicEnum>(_mode_local);
    enumerant.field_1._56_8_ = RVar12.schema.super_Schema.raw;
    enumValue.schema.super_Schema.raw._0_2_ = RVar12.value;
    local_1e8 = (undefined1  [8])enumerant.field_1._56_8_;
    DynamicEnum::getEnumerant(&local_288,(DynamicEnum *)local_1e8);
    other_00 = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_288);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_240,other_00);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_288);
    pEVar8 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_240);
    if (pEVar8 == (Enumerant *)0x0) {
      local_2cd = (kj)0x28;
      local_2d0 = DynamicEnum::getRaw((DynamicEnum *)local_1e8);
      structValue.reader._47_1_ = 0x29;
      kj::strTree<char,unsigned_short,char>
                (__return_storage_ptr__,&local_2cd,(char *)&local_2d0,
                 (unsigned_short *)&structValue.reader.field_0x2f,pcVar11);
    }
    else {
      pEVar8 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator->
                         ((NullableValue<capnp::EnumSchema::Enumerant> *)local_240);
      EnumSchema::Enumerant::getProto(&local_2c8,pEVar8);
      local_298 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&local_2c8);
      kj::strTree<capnp::Text::Reader>(__return_storage_ptr__,(Reader *)&local_298);
    }
    local_2cc = 1;
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_240);
    break;
  case STRUCT:
    __return_storage_ptr___00 = &unionFields.size_;
    DynamicValue::Reader::as<capnp::DynamicStruct>
              ((ReaderFor<capnp::DynamicStruct> *)__return_storage_ptr___00,_mode_local);
    nonUnionFields._64_8_ = DynamicStruct::Reader::getSchema((Reader *)__return_storage_ptr___00);
    StructSchema::getUnionFields((FieldSubset *)local_358,(StructSchema *)&nonUnionFields.size_);
    printedFields.builder.disposer =
         (ArrayDisposer *)DynamicStruct::Reader::getSchema((Reader *)__return_storage_ptr___00);
    StructSchema::getNonUnionFields
              ((FieldSubset *)local_3a8,(StructSchema *)&printedFields.builder.disposer);
    uVar6 = StructSchema::FieldSubset::size((FieldSubset *)local_3a8);
    uVar7 = StructSchema::FieldSubset::size((FieldSubset *)local_358);
    kj::Vector<kj::StringTree>::Vector
              ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit,
               (ulong)((uVar6 + 1) - (uint)(uVar7 == 0)));
    DynamicStruct::Reader::which
              ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer,
               (Reader *)__return_storage_ptr___00);
    kj::StringTree::StringTree((StringTree *)&field);
    fieldProto._reader._40_8_ =
         kj::_::readMaybe<capnp::StructSchema::Field>
                   ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
    if ((Field *)fieldProto._reader._40_8_ != (Field *)0x0) {
      StructSchema::Field::getProto((Reader *)local_488,(Field *)fieldProto._reader._40_8_);
      uVar3 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)local_488);
      if (uVar3 == 0) {
        local_4c8 = *(undefined8 *)fieldProto._reader._40_8_;
        uStack_4c0 = *(undefined8 *)(fieldProto._reader._40_8_ + 8);
        local_4b8 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x10);
        uStack_4b0 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x18);
        local_4a8 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x20);
        uStack_4a0 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x28);
        local_498 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x30);
        uStack_490 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x38);
        bVar2 = DynamicStruct::Reader::has
                          ((Reader *)&unionFields.size_,*(Field *)fieldProto._reader._40_8_,NON_NULL
                          );
        if (!bVar2) {
          kj::Maybe<capnp::StructSchema::Field>::operator=
                    ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer,(void *)0x0)
          ;
          goto LAB_0084c13b;
        }
      }
      local_510 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_488);
      DynamicStruct::Reader::get
                (&local_590,(Reader *)&unionFields.size_,*(Field *)fieldProto._reader._40_8_);
      WVar4 = whichFieldType((Field *)fieldProto._reader._40_8_);
      indent_00 = Indent::next((Indent *)((long)&value_local + 4));
      pSVar9 = (StringTree *)0x1;
      print(&local_548,&local_590,WVar4,indent_00,PREFIXED);
      kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                (&local_500,(kj *)&local_510,(Reader *)" = ",(char (*) [4])&local_548,pSVar9);
      kj::StringTree::operator=((StringTree *)&field,&local_500);
      kj::StringTree::~StringTree(&local_500);
      kj::StringTree::~StringTree(&local_548);
      DynamicValue::Reader::~Reader(&local_590);
    }
LAB_0084c13b:
    __begin3._8_8_ = local_3a8;
    IVar13 = StructSchema::FieldSubset::begin((FieldSubset *)__begin3._8_8_);
    __end3._8_8_ = IVar13.container;
    __begin3.container._0_4_ = IVar13.index;
    local_5f8 = (undefined1  [8])__end3._8_8_;
    IVar13 = StructSchema::FieldSubset::end((FieldSubset *)__begin3._8_8_);
    field_1.proto._reader._40_8_ = IVar13.container;
    __end3.container._0_4_ = IVar13.index;
    local_618 = (undefined1  [8])field_1.proto._reader._40_8_;
    while( true ) {
      bVar2 = capnp::_::
              IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
              operator!=((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                          *)local_5f8,
                         (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                          *)local_618);
      if (!bVar2) break;
      capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
      ::operator*((Field *)&unionField,
                  (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                   *)local_5f8);
      local_670 = kj::_::readMaybe<capnp::StructSchema::Field>
                            ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
      if (local_670 != (Field *)0x0) {
        uVar6 = StructSchema::Field::getIndex(local_670);
        uVar7 = StructSchema::Field::getIndex((Field *)&unionField);
        if (uVar6 < uVar7) {
          pSVar9 = kj::mv<kj::StringTree>((StringTree *)&field);
          kj::Vector<kj::StringTree>::add<kj::StringTree>
                    ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit
                     ,pSVar9);
          kj::Maybe<capnp::StructSchema::Field>::operator=
                    ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer,(void *)0x0)
          ;
        }
      }
      local_688 = field_1.proto._reader.pointers;
      SStack_680 = field_1.proto._reader.dataSize;
      SStack_67c = field_1.proto._reader.pointerCount;
      uStack_67a = field_1.proto._reader._38_2_;
      local_698 = field_1.proto._reader.capTable;
      pvStack_690 = field_1.proto._reader.data;
      local_6a8 = field_1.index;
      uStack_6a4 = field_1._12_4_;
      pSStack_6a0 = field_1.proto._reader.segment;
      local_6b8 = unionField;
      SStack_6b0 = field_1.parent.super_Schema.raw;
      field_00._8_8_ = field_1.parent.super_Schema.raw;
      field_00.parent.super_Schema.raw = (Schema)(Schema)unionField;
      field_00.proto._reader.segment = (SegmentReader *)field_1._8_8_;
      field_00.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
      field_00.proto._reader.data = field_1.proto._reader.capTable;
      field_00.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
      field_00.proto._reader._32_8_ = field_1.proto._reader.pointers;
      field_00.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
      field_00.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
      field_00.proto._reader._46_2_ = field_1.proto._reader._38_2_;
      bVar2 = DynamicStruct::Reader::has((Reader *)&unionFields.size_,field_00,NON_NULL);
      if (bVar2) {
        StructSchema::Field::getProto(&local_730,(Field *)&unionField);
        AVar14 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_730);
        local_7c8 = field_1.proto._reader.pointers;
        SStack_7c0 = field_1.proto._reader.dataSize;
        SStack_7bc = field_1.proto._reader.pointerCount;
        uStack_7ba = field_1.proto._reader._38_2_;
        local_7d8 = field_1.proto._reader.capTable;
        pvStack_7d0 = field_1.proto._reader.data;
        local_7e8 = field_1.index;
        uStack_7e4 = field_1._12_4_;
        pSStack_7e0 = field_1.proto._reader.segment;
        local_7f8 = unionField;
        SStack_7f0 = field_1.parent.super_Schema.raw;
        field_01._8_8_ = field_1.parent.super_Schema.raw;
        field_01.parent.super_Schema.raw = (Schema)(Schema)unionField;
        field_01.proto._reader.segment = (SegmentReader *)field_1._8_8_;
        field_01.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
        field_01.proto._reader.data = field_1.proto._reader.capTable;
        field_01.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
        field_01.proto._reader._32_8_ = field_1.proto._reader.pointers;
        field_01.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
        field_01.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
        field_01.proto._reader._46_2_ = field_1.proto._reader._38_2_;
        local_700 = AVar14;
        DynamicStruct::Reader::get(&local_7b0,(Reader *)&unionFields.size_,field_01);
        WVar4 = whichFieldType((Field *)&unionField);
        local_7fc = (uint)Indent::next((Indent *)((long)&value_local + 4));
        pSVar9 = (StringTree *)0x1;
        print(&local_768,&local_7b0,WVar4,(Indent)local_7fc,PREFIXED);
        kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                  (&local_6f0,(kj *)&local_700,(Reader *)" = ",(char (*) [4])&local_768,pSVar9);
        kj::Vector<kj::StringTree>::add<kj::StringTree>
                  ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit,
                   &local_6f0);
        kj::StringTree::~StringTree(&local_6f0);
        kj::StringTree::~StringTree(&local_768);
        DynamicValue::Reader::~Reader(&local_7b0);
      }
      capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
      ::operator++((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                    *)local_5f8);
    }
    bVar2 = kj::Maybe<capnp::StructSchema::Field>::operator!=
                      ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer,
                       (void *)0x0);
    if (bVar2) {
      pSVar9 = kj::mv<kj::StringTree>((StringTree *)&field);
      kj::Vector<kj::StringTree>::add<kj::StringTree>
                ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit,
                 pSVar9);
    }
    if (local_28 == PARENTHESIZED) {
      kj::Vector<kj::StringTree>::releaseAsArray
                (&local_818,
                 (Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit);
      Indent::delimit(__return_storage_ptr__,(Indent *)((long)&value_local + 4),&local_818,local_28,
                      RECORD);
      kj::Array<kj::StringTree>::~Array(&local_818);
    }
    else {
      local_819 = (kj)0x28;
      kj::Vector<kj::StringTree>::releaseAsArray
                ((Array<kj::StringTree> *)(local_871 + 1),
                 (Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit);
      pcVar11 = (char *)0x1;
      Indent::delimit(&local_858,(Indent *)((long)&value_local + 4),
                      (Array<kj::StringTree> *)(local_871 + 1),local_28,RECORD);
      local_871[0] = 0x29;
      kj::strTree<char,kj::StringTree,char>
                (__return_storage_ptr__,&local_819,(char *)&local_858,(StringTree *)local_871,
                 pcVar11);
      kj::StringTree::~StringTree(&local_858);
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)(local_871 + 1));
    }
    local_2cc = 1;
    kj::StringTree::~StringTree((StringTree *)&field);
    kj::Maybe<capnp::StructSchema::Field>::~Maybe
              ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
    kj::Vector<kj::StringTree>::~Vector
              ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit);
    break;
  case CAPABILITY:
    kj::strTree<char_const(&)[22]>(__return_storage_ptr__,(kj *)"<external capability>",params);
    break;
  case ANY_POINTER:
    kj::strTree<char_const(&)[17]>
              (__return_storage_ptr__,(kj *)"<opaque pointer>",(char (*) [17])params);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree print(const DynamicValue::Reader& value,
                            schema::Type::Which which, Indent indent,
                            PrintMode mode) {
  switch (value.getType()) {
    case DynamicValue::UNKNOWN:
      return kj::strTree("?");
    case DynamicValue::VOID:
      return kj::strTree("void");
    case DynamicValue::BOOL:
      return kj::strTree(value.as<bool>() ? "true" : "false");
    case DynamicValue::INT:
      return kj::strTree(value.as<int64_t>());
    case DynamicValue::UINT:
      return kj::strTree(value.as<uint64_t>());
    case DynamicValue::FLOAT:
      if (which == schema::Type::FLOAT32) {
        return kj::strTree(value.as<float>());
      } else {
        return kj::strTree(value.as<double>());
      }
    case DynamicValue::TEXT:
    case DynamicValue::DATA: {
      // TODO(someday): Maybe data should be printed as binary literal.
      kj::ArrayPtr<const char> chars;
      if (value.getType() == DynamicValue::DATA) {
        chars = value.as<Data>().asChars();
      } else {
        chars = value.as<Text>();
      }

      return kj::strTree('"', kj::encodeCEscape(chars), '"');
    }
    case DynamicValue::LIST: {
      auto listValue = value.as<DynamicList>();
      auto which = listValue.getSchema().whichElementType();
      kj::Array<kj::StringTree> elements = KJ_MAP(element, listValue) {
        return print(element, which, indent.next(), BARE);
      };
      return kj::strTree('[', indent.delimit(kj::mv(elements), mode, PrintKind::LIST), ']');
    }
    case DynamicValue::ENUM: {
      auto enumValue = value.as<DynamicEnum>();
      KJ_IF_MAYBE(enumerant, enumValue.getEnumerant()) {
        return kj::strTree(enumerant->getProto().getName());
      } else {
        // Unknown enum value; output raw number.
        return kj::strTree('(', enumValue.getRaw(), ')');
      }
      break;
    }
    case DynamicValue::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto unionFields = structValue.getSchema().getUnionFields();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      kj::Vector<kj::StringTree> printedFields(nonUnionFields.size() + (unionFields.size() != 0));

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();

      kj::StringTree unionValue;
      KJ_IF_MAYBE(field, which) {
        // Even if the union field has its default value, if it is not the default field of the
        // union then we have to print it anyway.
        auto fieldProto = field->getProto();
        if (fieldProto.getDiscriminantValue() != 0 || structValue.has(*field)) {
          unionValue = kj::strTree(
              fieldProto.getName(), " = ",
              print(structValue.get(*field), whichFieldType(*field), indent.next(), PREFIXED));
        } else {
          which = nullptr;
        }
      }

      for (auto field: nonUnionFields) {
        KJ_IF_MAYBE(unionField, which) {
          if (unionField->getIndex() < field.getIndex()) {
            printedFields.add(kj::mv(unionValue));
            which = nullptr;
          }
        }
        if (structValue.has(field)) {
          printedFields.add(kj::strTree(
              field.getProto().getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED)));
        }
      }
      if (which != nullptr) {
        // Union value is last.
        printedFields.add(kj::mv(unionValue));
      }

      if (mode == PARENTHESIZED) {
        return indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD);
      } else {
        return kj::strTree(
            '(', indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD), ')');
      }
    }
    case DynamicValue::CAPABILITY:
      return kj::strTree("<external capability>");
    case DynamicValue::ANY_POINTER:
      return kj::strTree("<opaque pointer>");
  }